

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O0

char * whisper_model_type_readable(whisper_context *ctx)

{
  whisper_context *ctx_local;
  char *local_8;
  
  switch((ctx->model).type) {
  case MODEL_TINY:
    local_8 = "tiny";
    break;
  case MODEL_BASE:
    local_8 = "base";
    break;
  case MODEL_SMALL:
    local_8 = "small";
    break;
  case MODEL_MEDIUM:
    local_8 = "medium";
    break;
  case MODEL_LARGE:
    local_8 = "large";
    break;
  default:
    local_8 = "unknown";
  }
  return local_8;
}

Assistant:

const char *whisper_model_type_readable(struct whisper_context * ctx) {
    switch (ctx->model.type) {
    case e_model::MODEL_TINY:
        return "tiny";
    case e_model::MODEL_BASE:
        return "base";
    case e_model::MODEL_SMALL:
        return "small";
    case e_model::MODEL_MEDIUM:
        return "medium";
    case e_model::MODEL_LARGE:
        return "large";
    default:
        return "unknown";
    }
}